

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O0

pssize p_socket_receive_from
                 (PSocket *socket,PSocketAddress **address,pchar *buffer,psize buflen,PError **error
                 )

{
  pboolean pVar1;
  pint err_code_00;
  PSocketAddress *pPVar2;
  bool bVar3;
  pint err_code;
  pssize ret;
  undefined1 local_c0 [4];
  socklen_t optlen;
  sockaddr_storage sa;
  PErrorIO sock_err;
  PError **error_local;
  psize buflen_local;
  pchar *buffer_local;
  PSocketAddress **address_local;
  PSocket *socket_local;
  
  bVar3 = true;
  if ((socket != (PSocket *)0x0) && (bVar3 = true, buffer != (pchar *)0x0)) {
    bVar3 = buflen == 0;
  }
  if (bVar3) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    socket_local = (PSocket *)0xffffffffffffffff;
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    if (pVar1 == 0) {
      socket_local = (PSocket *)0xffffffffffffffff;
    }
    else {
      ret._4_4_ = 0x80;
      while( true ) {
        if (((socket->field_0x18 & 1) != 0) &&
           (pVar1 = p_socket_io_condition_wait(socket,P_SOCKET_IO_CONDITION_POLLIN,error),
           pVar1 == 0)) {
          return -1;
        }
        socket_local = (PSocket *)
                       recvfrom(socket->fd,buffer,buflen & 0xffffffff,0,(sockaddr *)local_c0,
                                (socklen_t *)((long)&ret + 4));
        if (-1 < (long)socket_local) break;
        err_code_00 = p_error_get_last_net();
        if (err_code_00 != 4) {
          sa.__ss_align._4_4_ = p_error_get_io_from_system(err_code_00);
          if (((socket->field_0x18 & 1) == 0) || (sa.__ss_align._4_4_ != P_ERROR_IO_WOULD_BLOCK)) {
            p_error_set_error_p(error,sa.__ss_align._4_4_,err_code_00,
                                "Failed to call recvfrom() on socket");
            return -1;
          }
          sa.__ss_align._4_4_ = 0x1fe;
        }
      }
      if (address != (PSocketAddress **)0x0) {
        pPVar2 = p_socket_address_new_from_native(local_c0,(ulong)ret._4_4_);
        *address = pPVar2;
      }
    }
  }
  return (pssize)socket_local;
}

Assistant:

P_LIB_API pssize
p_socket_receive_from (const PSocket	*socket,
		       PSocketAddress	**address,
		       pchar		*buffer,
		       psize		buflen,
		       PError		**error)
{
	PErrorIO		sock_err;
	struct sockaddr_storage sa;
	socklen_t		optlen;
	pssize			ret;
	pint			err_code;

	if (P_UNLIKELY (socket == NULL || buffer == NULL || buflen == 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return -1;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return -1;

	optlen = sizeof (sa);

	for (;;) {
		if (socket->blocking &&
		    p_socket_io_condition_wait (socket,
						P_SOCKET_IO_CONDITION_POLLIN,
						error) == FALSE)
			return -1;

		if ((ret = recvfrom (socket->fd,
				     buffer,
				     (socklen_t) buflen,
				     0,
				     (struct sockaddr *) &sa,
				     &optlen)) < 0) {
			err_code = p_error_get_last_net ();

#if !defined (P_OS_WIN) && defined (EINTR)
			if (err_code == EINTR)
				continue;
#endif
			sock_err = p_error_get_io_from_system (err_code);

			if (socket->blocking && sock_err == P_ERROR_IO_WOULD_BLOCK)
				continue;

			p_error_set_error_p (error,
					     (pint) sock_err,
					     err_code,
					     "Failed to call recvfrom() on socket");

			return -1;
		}

		break;
	}

	if (address != NULL)
		*address = p_socket_address_new_from_native (&sa, optlen);

	return ret;
}